

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,ptls_async_job_t **async,
                    uint16_t *selected_algorithm,ptls_buffer_t *outbuf,ptls_iovec_t input,
                    uint16_t *algorithms,size_t num_algorithms)

{
  ptls_openssl_signature_scheme_t *scheme_00;
  async_sign_ctx *sign_ctx;
  ptls_openssl_signature_scheme_t *scheme;
  ptls_openssl_sign_certificate_t *self;
  uint16_t *algorithms_local;
  ptls_buffer_t *outbuf_local;
  uint16_t *selected_algorithm_local;
  ptls_async_job_t **async_local;
  ptls_t *tls_local;
  ptls_sign_certificate_t *_self_local;
  
  if ((async == (ptls_async_job_t **)0x0) || (*async == (ptls_async_job_t *)0x0)) {
    scheme_00 = ptls_openssl_select_signature_scheme
                          ((ptls_openssl_signature_scheme_t *)_self[2].cb,algorithms,num_algorithms)
    ;
    if (scheme_00 == (ptls_openssl_signature_scheme_t *)0x0) {
      _self_local._4_4_ = 0x28;
    }
    else {
      *selected_algorithm = scheme_00->scheme_id;
      selected_algorithm_local = (uint16_t *)async;
      if ((((ulong)_self[3].cb & 1) == 0) && (async != (ptls_async_job_t **)0x0)) {
        if (*async != (ptls_async_job_t *)0x0) {
          __assert_fail("*async == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c"
                        ,0x5ea,
                        "int sign_certificate(ptls_sign_certificate_t *, ptls_t *, ptls_async_job_t **, uint16_t *, ptls_buffer_t *, ptls_iovec_t, const uint16_t *, size_t)"
                       );
        }
        selected_algorithm_local = (uint16_t *)0x0;
      }
      _self_local._4_4_ =
           do_sign((EVP_PKEY *)_self[1].cb,scheme_00,outbuf,input,
                   (ptls_async_job_t **)selected_algorithm_local);
    }
  }
  else {
    *selected_algorithm = *(uint16_t *)(*async)[1].destroy_;
    _self_local._4_4_ = do_sign_async(outbuf,async);
  }
  return _self_local._4_4_;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                            ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const ptls_openssl_signature_scheme_t *scheme;

    /* Just resume the asynchronous operation, if one is in flight. */
#if PTLS_OPENSSL_HAVE_ASYNC
    if (async != NULL && *async != NULL) {
        struct async_sign_ctx *sign_ctx = (struct async_sign_ctx *)(*async);
        *selected_algorithm = sign_ctx->scheme->scheme_id;
        return do_sign_async(outbuf, async);
    }
#endif

    /* Select the algorithm or return failure if none found. */
    if ((scheme = ptls_openssl_select_signature_scheme(self->schemes, algorithms, num_algorithms)) == NULL)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    *selected_algorithm = scheme->scheme_id;

#if PTLS_OPENSSL_HAVE_ASYNC
    if (!self->async && async != NULL) {
        /* indicate to `do_sign` that async mode is disabled for this operation */
        assert(*async == NULL);
        async = NULL;
    }
#endif
    return do_sign(self->key, scheme, outbuf, input, async);
}